

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHTTP.cpp
# Opt level: O0

void __thiscall
adios2::transport::FileHTTP::Open
          (FileHTTP *this,string *name,Mode openMode,bool async,bool directio)

{
  uint16_t uVar1;
  char *pcVar2;
  byte in_CL;
  string *in_RSI;
  string *in_RDI;
  byte in_R8B;
  uint32_t addr_tmp;
  hostent *hostent;
  protoent *protoent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  allocator *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  int commRank;
  string *in_stack_fffffffffffffda8;
  string *in_stack_fffffffffffffdb0;
  string *in_stack_fffffffffffffdc0;
  string local_238 [32];
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [36];
  in_addr_t local_17c;
  string local_178 [39];
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  undefined1 local_b1 [40];
  undefined1 local_89 [56];
  undefined1 local_51 [37];
  in_addr_t local_2c;
  hostent *local_28;
  protoent *local_20;
  byte local_16;
  byte local_15;
  
  local_15 = in_CL & 1;
  local_16 = in_R8B & 1;
  std::__cxx11::string::operator=((string *)&in_RDI[2]._M_string_length,in_RSI);
  local_20 = getprotobyname("tcp");
  if (local_20 == (protoent *)0x0) {
    in_stack_fffffffffffffdb0 = (string *)local_51;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_51 + 1),"Toolkit",(allocator *)in_stack_fffffffffffffdb0);
    in_stack_fffffffffffffda8 = (string *)local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_89 + 1),"transport::file::FileHTTP",
               (allocator *)in_stack_fffffffffffffda8);
    in_stack_fffffffffffffda0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_b1 + 1),"Open",(allocator *)in_stack_fffffffffffffda0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"cannot make getprotobyname",&local_d9);
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_fffffffffffffdc0,in_RDI,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               (int)((ulong)in_stack_fffffffffffffda0 >> 0x20));
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    std::__cxx11::string::~string((string *)(local_b1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_b1);
    std::__cxx11::string::~string((string *)(local_89 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_89);
    std::__cxx11::string::~string((string *)(local_51 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_51);
  }
  *(int *)((long)&in_RDI[10].field_2 + 4) = local_20->p_proto;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_28 = gethostbyname(pcVar2);
  if (local_28 == (hostent *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"Toolkit",&local_101);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,"transport::file::FileHTTP",&local_129);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,"Open",&local_151);
    std::operator+((char *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_fffffffffffffdc0,in_RDI,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               (int)((ulong)in_stack_fffffffffffffda0 >> 0x20));
    std::__cxx11::string::~string(local_178);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
  }
  commRank = (int)((ulong)in_stack_fffffffffffffda0 >> 0x20);
  local_17c = *(in_addr_t *)*local_28->h_addr_list;
  pcVar2 = inet_ntoa((in_addr)local_17c);
  local_2c = inet_addr(pcVar2);
  if (local_2c == 0xffffffff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,"Toolkit",&local_1a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c8,"transport::file::FileHTTP",&local_1c9);
    __lhs = &local_1f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f0,"Open",__lhs);
    pcVar2 = *local_28->h_addr_list;
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xfffffffffffffdc7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,pcVar2,(allocator *)__rhs);
    std::operator+((char *)__lhs,__rhs);
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_fffffffffffffdc0,in_RDI,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
               commRank);
    std::__cxx11::string::~string(local_218);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdc7);
    std::__cxx11::string::~string(local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
    std::__cxx11::string::~string(local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  }
  *(in_addr_t *)&in_RDI[10]._M_string_length = local_2c;
  *(undefined2 *)&in_RDI[10].field_0x4 = 2;
  uVar1 = htons((uint16_t)*(undefined4 *)(in_RDI + 10));
  *(uint16_t *)&in_RDI[10].field_0x6 = uVar1;
  return;
}

Assistant:

void FileHTTP::Open(const std::string &name, const Mode openMode, const bool async,
                    const bool directio)
{
    struct protoent *protoent;
    struct hostent *hostent;
    uint32_t addr_tmp;

    m_Name = name;
    /* Build the socket. */
    protoent = getprotobyname("tcp");
    if (protoent == NULL)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "Open",
                                              "cannot make getprotobyname");
    }
    m_p_proto = protoent->p_proto;

    /* get from parameters. Where the proxy should run*/

    /* Build the address. */
#define _WINSOCK_DEPRECATED_NO_WARNINGS 1
    hostent = gethostbyname(m_hostname.c_str());
    if (hostent == NULL)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "Open",
                                              "error: gethostbyname " + m_hostname);
    }
    addr_tmp = inet_addr(inet_ntoa(*(struct in_addr *)*(hostent->h_addr_list)));
    if (addr_tmp == INADDR_NONE)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "Open",
                                              "error: inet_addr " +
                                                  std::string(*(hostent->h_addr_list)));
    }
    sockaddr_in.sin_addr.s_addr = addr_tmp;
    sockaddr_in.sin_family = AF_INET;
    sockaddr_in.sin_port = htons(m_server_port);

    return;
}